

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lprowsetbase.h
# Opt level: O0

LPRowSetBase<double> * __thiscall
soplex::LPRowSetBase<double>::operator=(LPRowSetBase<double> *this,LPRowSetBase<double> *rs)

{
  LPRowSetBase<double> *in_RSI;
  LPRowSetBase<double> *in_RDI;
  DataArray<int> *unaff_retaddr;
  SVSetBase<double> *in_stack_00000038;
  SVSetBase<double> *in_stack_00000040;
  LPRowSetBase<double> *rhs;
  
  if (in_RDI != in_RSI) {
    rhs = in_RDI;
    SVSetBase<double>::operator=(in_stack_00000040,in_stack_00000038);
    VectorBase<double>::operator=((VectorBase<double> *)in_RSI,(VectorBase<double> *)in_RDI);
    VectorBase<double>::operator=((VectorBase<double> *)in_RSI,(VectorBase<double> *)in_RDI);
    VectorBase<double>::operator=((VectorBase<double> *)in_RSI,(VectorBase<double> *)in_RDI);
    DataArray<int>::operator=(unaff_retaddr,(DataArray<int> *)rhs);
  }
  return in_RDI;
}

Assistant:

LPRowSetBase<R>& operator=(const LPRowSetBase<R>& rs)
   {
      if(this != &rs)
      {
         SVSetBase<R>::operator=(rs);
         left = rs.left;
         right = rs.right;
         object = rs.object;
         scaleExp = rs.scaleExp;

         assert(isConsistent());
      }

      return *this;
   }